

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

SampledSpectrum
pbrt::
SampleT_maj<pbrt::NanoVDBMedium,pbrt::VolPathIntegrator::SampleLd(pbrt::Interaction_const&,pbrt::BSDF_const*,pbrt::SampledWavelengths&,pbrt::Sampler,pbrt::SampledSpectrum,pbrt::SampledSpectrum)const::__0>
          (Ray *ray,Float tMax,Float u,RNG *rng,SampledWavelengths *lambda,
          anon_class_32_4_31dc8eb4 callback)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Point3f p;
  array<float,_4> aVar3;
  bool bVar4;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar5;
  RayMajorantSegment *pRVar6;
  Float *pFVar7;
  long in_RDI;
  float in_XMM0_Da;
  type tVar8;
  Float FVar9;
  undefined8 uVar17;
  undefined1 auVar18 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  float in_XMM1_Da;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar28 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  Vector3<float> VVar29;
  Point3f PVar30;
  SampledSpectrum SVar31;
  Float dt_1;
  MediumProperties mp;
  Float t;
  Float tMin;
  Float dt;
  optional<pbrt::RayMajorantSegment> seg;
  bool done;
  SampledSpectrum T_maj;
  MajorantIterator iter;
  NanoVDBMedium *medium;
  undefined4 in_stack_fffffffffffffbc8;
  Float in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbd0;
  Float in_stack_fffffffffffffbd4;
  undefined1 in_stack_fffffffffffffbd8 [16];
  Vector3<float> in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc18;
  Float in_stack_fffffffffffffc1c;
  float in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  DDAMajorantIterator *in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffcc8 [16];
  SampledSpectrum in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce8;
  float in_stack_fffffffffffffcec;
  RayMajorantSegment *in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf8;
  RayMajorantSegment *in_stack_fffffffffffffd08;
  float fVar32;
  undefined8 local_2a8;
  undefined8 local_2a0;
  float local_184;
  float local_160;
  Float local_14c;
  optional local_148 [31];
  byte local_129;
  undefined8 local_128;
  undefined8 uStack_120;
  NanoVDBMedium *local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_5c;
  float local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  float local_20;
  float local_1c;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar22 [64];
  
  local_48 = *(undefined4 *)(in_RDI + 0x14);
  local_50 = *(undefined8 *)(in_RDI + 0xc);
  local_40 = local_50;
  local_38 = local_48;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  tVar8 = Length<float>(in_stack_fffffffffffffbf8);
  local_1c = local_1c * tVar8;
  local_70 = *(undefined4 *)(in_RDI + 0x14);
  local_78 = *(undefined8 *)(in_RDI + 0xc);
  auVar18 = ZEXT856(0);
  VVar29.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffc1c;
  VVar29.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc18;
  VVar29.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc20;
  local_68 = local_78;
  local_60 = local_70;
  VVar29 = Normalize<float>(VVar29);
  local_80 = VVar29.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar29.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar18;
  local_88 = vmovlpd_avx(auVar10._0_16_);
  *(undefined8 *)(in_RDI + 0xc) = local_88;
  *(float *)(in_RDI + 0x14) = local_80;
  local_5c = local_88;
  local_54 = local_80;
  local_90 = TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
             ::Cast<pbrt::NanoVDBMedium>
                       ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
                         *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
           (Ray *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  NanoVDBMedium::SampleRay
            (in_stack_fffffffffffffcd8.values.values._8_8_,
             in_stack_fffffffffffffcd8.values.values._0_8_,in_stack_fffffffffffffcc8._12_4_,
             in_stack_fffffffffffffcc8._0_8_);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             in_stack_fffffffffffffbcc);
  local_129 = 0;
  do {
    if (((local_129 ^ 0xff) & 1) == 0) {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbcc);
      break;
    }
    DDAMajorantIterator::Next(in_stack_fffffffffffffc38);
    bVar4 = pstd::optional::operator_cast_to_bool(local_148);
    if (bVar4) {
      pRVar6 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                         ((optional<pbrt::RayMajorantSegment> *)0x81a485);
      fVar32 = SUB84(pRVar6,0);
      pFVar7 = SampledSpectrum::operator[]
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                          (int)in_stack_fffffffffffffbcc);
      if ((*pFVar7 != 0.0) || (NAN(*pFVar7))) {
        pRVar6 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x81a653);
        local_184 = pRVar6->tMin;
        while( true ) {
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x81a6a5);
          SampledSpectrum::operator[]
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     (int)in_stack_fffffffffffffbcc);
          FVar9 = SampleExponential(0.0,1.1906626e-38);
          local_184 = local_184 + FVar9;
          local_20 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffbd4,
                                                         in_stack_fffffffffffffbd0));
          pRVar6 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                             ((optional<pbrt::RayMajorantSegment> *)0x81a747);
          if (pRVar6->tMax <= local_184) break;
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = &DAT_8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar28 = ZEXT856(auVar20._8_8_);
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x81a7aa);
          auVar18 = (undefined1  [56])0x0;
          SVar31 = operator*(in_stack_fffffffffffffbd4,
                             (SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          auVar24._0_8_ = SVar31.values.values._8_8_;
          auVar24._8_56_ = auVar28;
          auVar13._0_8_ = SVar31.values.values._0_8_;
          auVar13._8_56_ = auVar18;
          vmovlpd_avx(auVar13._0_16_);
          vmovlpd_avx(auVar24._0_16_);
          SVar31 = FastExp((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
          auVar25._0_8_ = SVar31.values.values._8_8_;
          auVar25._8_56_ = auVar28;
          auVar14._0_8_ = SVar31.values.values._0_8_;
          auVar14._8_56_ = auVar18;
          vmovlpd_avx(auVar14._0_16_);
          vmovlpd_avx(auVar25._0_16_);
          SampledSpectrum::operator*=
                    (in_stack_fffffffffffffbd8._8_8_,in_stack_fffffffffffffbd8._0_8_);
          uVar17 = 0;
          PVar30 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffc24,
                                                   in_stack_fffffffffffffc20),
                                   in_stack_fffffffffffffc1c);
          auVar2._8_8_ = uVar17;
          auVar2._0_8_ = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
          vmovlpd_avx(auVar2);
          PVar30.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffcf8;
          PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffcf0;
          NanoVDBMedium::SamplePoint
                    (in_stack_fffffffffffffcd8.values.values._0_8_,PVar30,
                     in_stack_fffffffffffffcc8._8_8_);
          uVar17 = 0;
          PVar30 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffc24,
                                                   in_stack_fffffffffffffc20),
                                   in_stack_fffffffffffffc1c);
          in_stack_fffffffffffffc38 = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar1._8_8_ = uVar17;
          auVar1._0_8_ = in_stack_fffffffffffffc38;
          vmovlpd_avx(auVar1);
          MediumProperties::MediumProperties
                    ((MediumProperties *)
                     CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     (MediumProperties *)
                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x81a989);
          p.super_Tuple3<pbrt::Point3,_float>.z = fVar32;
          p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffd08;
          SVar31.values.values[1] = in_stack_fffffffffffffcec;
          SVar31.values.values[0] = (float)in_stack_fffffffffffffce8;
          SVar31.values.values._8_8_ = in_stack_fffffffffffffcf0;
          bVar4 = VolPathIntegrator::SampleLd::anon_class_32_4_31dc8eb4::operator()
                            (in_stack_fffffffffffffcc8._8_8_,p,in_stack_fffffffffffffcc8._0_8_,
                             SVar31,in_stack_fffffffffffffcd8);
          in_stack_fffffffffffffc24 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffc24);
          if (!bVar4) {
            local_129 = 1;
            goto LAB_0081ab94;
          }
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                     in_stack_fffffffffffffbcc);
          local_128 = local_2a8;
          uStack_120 = local_2a0;
        }
        pRVar6 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x81aa96);
        in_stack_fffffffffffffc1c = (Float)((ulong)pRVar6 >> 0x20);
        eVar5 = IsInf<float>(0.0);
        if (eVar5) {
          std::numeric_limits<float>::max();
        }
        auVar21._8_4_ = 0x80000000;
        auVar21._0_8_ = &DAT_8000000080000000;
        auVar21._12_4_ = 0x80000000;
        auVar28 = ZEXT856(auVar21._8_8_);
        pstd::optional<pbrt::RayMajorantSegment>::operator->
                  ((optional<pbrt::RayMajorantSegment> *)0x81ab12);
        auVar18 = (undefined1  [56])0x0;
        SVar31 = operator*(in_stack_fffffffffffffbd4,
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        auVar26._0_8_ = SVar31.values.values._8_8_;
        auVar26._8_56_ = auVar28;
        auVar15._0_8_ = SVar31.values.values._0_8_;
        auVar15._8_56_ = auVar18;
        vmovlpd_avx(auVar15._0_16_);
        vmovlpd_avx(auVar26._0_16_);
        SVar31 = FastExp((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
        auVar27._0_8_ = SVar31.values.values._8_8_;
        auVar27._8_56_ = auVar28;
        auVar16._0_8_ = SVar31.values.values._0_8_;
        auVar16._8_56_ = auVar18;
        in_stack_fffffffffffffbd8 = auVar27._0_16_;
        vmovlpd_avx(auVar16._0_16_);
        vmovlpd_avx(in_stack_fffffffffffffbd8);
        SampledSpectrum::operator*=(auVar28._0_8_,auVar27._0_8_);
LAB_0081ab94:
        local_14c = 0.0;
      }
      else {
        in_stack_fffffffffffffd08 =
             pstd::optional<pbrt::RayMajorantSegment>::operator->
                       ((optional<pbrt::RayMajorantSegment> *)0x81a4c7);
        local_160 = in_stack_fffffffffffffd08->tMax;
        pRVar6 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x81a4f4);
        local_160 = local_160 - pRVar6->tMin;
        eVar5 = IsInf<float>(0.0);
        in_stack_fffffffffffffcf8 = (float)CONCAT13(eVar5,SUB43(in_stack_fffffffffffffcf8,0));
        if (eVar5) {
          local_160 = std::numeric_limits<float>::max();
        }
        auVar19._8_4_ = 0x80000000;
        auVar19._0_8_ = &DAT_8000000080000000;
        auVar19._12_4_ = 0x80000000;
        auVar28 = ZEXT856(auVar19._8_8_);
        in_stack_fffffffffffffcec = -local_160;
        in_stack_fffffffffffffcf0 =
             pstd::optional<pbrt::RayMajorantSegment>::operator->
                       ((optional<pbrt::RayMajorantSegment> *)0x81a5a6);
        auVar18 = (undefined1  [56])0x0;
        SVar31 = operator*(in_stack_fffffffffffffbd4,
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        auVar22._0_8_ = SVar31.values.values._8_8_;
        auVar22._8_56_ = auVar28;
        auVar11._0_8_ = SVar31.values.values._0_8_;
        auVar11._8_56_ = auVar18;
        vmovlpd_avx(auVar11._0_16_);
        vmovlpd_avx(auVar22._0_16_);
        SVar31 = FastExp((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
        auVar23._0_8_ = SVar31.values.values._8_8_;
        auVar23._8_56_ = auVar28;
        auVar12._0_8_ = SVar31.values.values._0_8_;
        auVar12._8_56_ = auVar18;
        in_stack_fffffffffffffcc8 = auVar23._0_16_;
        in_stack_fffffffffffffcd8.values.values = auVar12._0_16_;
        vmovlpd_avx((undefined1  [16])in_stack_fffffffffffffcd8.values.values);
        vmovlpd_avx(in_stack_fffffffffffffcc8);
        SampledSpectrum::operator*=(in_stack_fffffffffffffbd8._8_8_,in_stack_fffffffffffffbd8._0_8_)
        ;
        local_14c = 2.8026e-45;
      }
    }
    else {
      local_10 = local_128;
      local_8 = uStack_120;
      local_14c = 1.4013e-45;
    }
    pstd::optional<pbrt::RayMajorantSegment>::~optional
              ((optional<pbrt::RayMajorantSegment> *)0x81abac);
    in_stack_fffffffffffffbd4 = local_14c;
  } while ((local_14c == 0.0) || (local_14c != 1.4013e-45));
  aVar3.values[2] = (float)(undefined4)local_8;
  aVar3.values[3] = (float)local_8._4_4_;
  aVar3.values[0] = (float)(undefined4)local_10;
  aVar3.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum SampleT_maj(Ray ray, Float tMax, Float u, RNG &rng,
                                         const SampledWavelengths &lambda, F callback) {
    // Normalize ray direction and update _tMax_ accordingly
    tMax *= Length(ray.d);
    ray.d = Normalize(ray.d);

    // Initialize _MajorantIterator_ for ray majorant sampling
    ConcreteMedium *medium = ray.medium.Cast<ConcreteMedium>();
    typename ConcreteMedium::MajorantIterator iter = medium->SampleRay(ray, tMax, lambda);

    // Generate ray majorant samples until termination
    SampledSpectrum T_maj(1.f);
    bool done = false;
    while (!done) {
        // Get next majorant segment from iterator and sample it
        pstd::optional<RayMajorantSegment> seg = iter.Next();
        if (!seg)
            return T_maj;
        // Handle zero-valued majorant for current segment
        if (seg->sigma_maj[0] == 0) {
            Float dt = seg->tMax - seg->tMin;
            // Handle infinite _dt_ for ray majorant segment
            if (IsInf(dt))
                dt = std::numeric_limits<Float>::max();

            T_maj *= FastExp(-dt * seg->sigma_maj);
            continue;
        }

        // Generate samples along current majorant segment
        Float tMin = seg->tMin;
        while (true) {
            // Try to generate sample along current majorant segment
            Float t = tMin + SampleExponential(u, seg->sigma_maj[0]);
            PBRT_DBG("Sampled t = %f from tMin %f u %f sigma_maj[0] %f\n", t, tMin, u,
                     seg->sigma_maj[0]);
            u = rng.Uniform<Float>();
            if (t < seg->tMax) {
                // Call callback function for sample within segment
                PBRT_DBG("t < seg->tMax\n");
                T_maj *= FastExp(-(t - tMin) * seg->sigma_maj);
                MediumProperties mp = medium->SamplePoint(ray(t), lambda);
                if (!callback(ray(t), mp, seg->sigma_maj, T_maj)) {
                    // Returning out of doubly-nested while loop is not as good perf. wise
                    // on the GPU vs using "done" here.
                    done = true;
                    break;
                }
                T_maj = SampledSpectrum(1.f);
                tMin = t;

            } else {
                // Handle sample past end of majorant segment
                Float dt = seg->tMax - tMin;
                // Handle infinite _dt_ for ray majorant segment
                if (IsInf(dt))
                    dt = std::numeric_limits<Float>::max();

                T_maj *= FastExp(-dt * seg->sigma_maj);
                PBRT_DBG("Past end, added dt %f * maj[0] %f\n", dt, seg->sigma_maj[0]);
                break;
            }
        }
    }
    return SampledSpectrum(1.f);
}